

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O2

int __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::init(BufferAgeTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  NativeDisplay *pNVar1;
  bool bVar2;
  Visibility VVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  GLenum err;
  Library *pLVar7;
  EGLDisplay pvVar8;
  Library *egl;
  FilterList *this_00;
  EGLConfig pvVar9;
  NativeWindowFactory *pNVar10;
  undefined4 extraout_var;
  EGLSurface pvVar11;
  undefined4 extraout_var_00;
  GLES2Renderer *pGVar12;
  ReferenceRenderer *pRVar13;
  NotSupportedError *this_01;
  allocator<char> local_152;
  allocator<char> local_151;
  Library *local_150;
  string local_148;
  string local_128;
  EGLint attribList [3];
  undefined4 uStack_fc;
  
  pLVar7 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar8 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar8;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar8 = this->m_eglDisplay;
  bVar2 = this->m_preserveColorBuffer;
  attribList[0] = 0;
  attribList[1] = 0;
  stack0xffffffffffffff00 = (pointer)0x0;
  this_00 = eglu::FilterList::operator<<((FilterList *)attribList,isWindow);
  eglu::FilterList::operator<<(this_00,isES2Renderable);
  if (bVar2 != false) {
    eglu::FilterList::operator<<((FilterList *)attribList,hasPreserveSwap);
  }
  pvVar9 = eglu::chooseSingleConfig(egl,pvVar8,(FilterList *)attribList);
  local_150 = pLVar7;
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base((_Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                   *)attribList);
  this->m_eglConfig = pvVar9;
  if (pvVar9 == (EGLConfig)0x0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"No supported config found",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
               ,0x188);
  }
  else {
    pNVar10 = eglu::selectNativeWindowFactory
                        (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplayFactory,
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine
                        );
    pvVar8 = this->m_eglDisplay;
    pNVar1 = (((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
             ptr;
    VVar3 = eglu::parseWindowVisibility
                      (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
    attribList[0] = 0x1e0;
    attribList[1] = 0x1e0;
    attribList[2] = VVar3;
    iVar4 = (*(pNVar10->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar10,pNVar1,pvVar8,pvVar9,0,attribList);
    this->m_window = (NativeWindow *)CONCAT44(extraout_var,iVar4);
    pvVar11 = eglu::createWindowSurface
                        ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                         super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                         .m_data.ptr,(NativeWindow *)CONCAT44(extraout_var,iVar4),this->m_eglDisplay
                         ,pvVar9,(EGLAttrib *)0x0);
    this->m_eglSurface = pvVar11;
    pvVar9 = this->m_eglConfig;
    pLVar7 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    attribList[0] = 0x3098;
    attribList[1] = 2;
    stack0xffffffffffffff00 = (pointer)CONCAT44(uStack_fc,0x3038);
    (**pLVar7->_vptr_Library)(pLVar7,0x30a0);
    iVar4 = (*pLVar7->_vptr_Library[6])(pLVar7,this->m_eglDisplay,pvVar9,0,attribList);
    this->m_eglContext = (EGLContext)CONCAT44(extraout_var_00,iVar4);
    dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
    eglu::checkError(dVar5,"eglCreateContext",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                     ,0x1cb);
    (*pLVar7->_vptr_Library[0x27])
              (pLVar7,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext);
    dVar5 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
    eglu::checkError(dVar5,"eglMakeCurrent",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                     ,0x1ce);
    dst = &this->m_gl;
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
    pvVar8 = this->m_eglDisplay;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)attribList,"EGL_EXT_buffer_age",(allocator<char> *)&local_148);
    bVar2 = eglu::hasExtension(local_150,pvVar8,(string *)attribList);
    std::__cxx11::string::~string((string *)attribList);
    if (bVar2) {
      pGVar12 = (GLES2Renderer *)operator_new(0xe0);
      pGVar12->m_gl = dst;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,
                 "attribute mediump vec4 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = a_pos;\n}"
                 ,&local_151);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,
                 "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}",
                 &local_152);
      glu::makeVtxFragSources((ProgramSources *)attribList,&local_148,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      glu::ShaderProgram::ShaderProgram(&pGVar12->m_glProgram,dst,(ProgramSources *)attribList);
      glu::ProgramSources::~ProgramSources((ProgramSources *)attribList);
      pGVar12->m_coordLoc = 0xffffffff;
      pGVar12->m_colorLoc = 0xffffffff;
      GVar6 = (*pGVar12->m_gl->getAttribLocation)
                        ((pGVar12->m_glProgram).m_program.m_program,"a_color");
      pGVar12->m_colorLoc = GVar6;
      GVar6 = (*pGVar12->m_gl->getAttribLocation)
                        ((pGVar12->m_glProgram).m_program.m_program,"a_pos");
      pGVar12->m_coordLoc = GVar6;
      err = (*pGVar12->m_gl->getError)();
      glu::checkError(err,"Failed to get attribute locations",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
                      ,0xfb);
      this->m_gles2Renderer = pGVar12;
      pRVar13 = (ReferenceRenderer *)operator_new(1);
      this->m_refRenderer = pRVar13;
      return (int)pRVar13;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"EGL_EXT_buffer_age is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
               ,0x191);
  }
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferAgeTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	m_eglDisplay = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig	 = getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay, m_preserveColorBuffer);

	if (m_eglConfig == DE_NULL)
		TCU_THROW(NotSupportedError, "No supported config found");

	//create surface and context and make them current
	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	if (eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_buffer_age") == false)
		TCU_THROW(NotSupportedError, "EGL_EXT_buffer_age is not supported");

	m_gles2Renderer = new GLES2Renderer(m_gl);
	m_refRenderer   = new ReferenceRenderer();
}